

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundComparisonExpression::Deserialize
          (BoundComparisonExpression *this,Deserializer *deserializer)

{
  ExpressionType type;
  BoundComparisonExpression *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  undefined1 local_28 [8];
  Expression *local_20;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xc8);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)local_28,(field_id_t)deserializer,(char *)0xc9);
  this_00 = (BoundComparisonExpression *)operator_new(0x68);
  type = SerializationData::Get<duckdb::ExpressionType>(&deserializer->data);
  local_30._M_head_impl = local_20;
  local_20 = (Expression *)0x0;
  local_38._M_head_impl = (Expression *)local_28;
  local_28 = (undefined1  [8])0x0;
  BoundComparisonExpression
            (this_00,type,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_30,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_38);
  if (local_38._M_head_impl != (Expression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_38._M_head_impl = (Expression *)0x0;
  if (local_30._M_head_impl != (Expression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_30._M_head_impl = (Expression *)0x0;
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  if (local_28 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_28 + 8))();
  }
  if (local_20 != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_20 + 8))();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundComparisonExpression::Deserialize(Deserializer &deserializer) {
	auto left = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "left");
	auto right = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(201, "right");
	auto result = duckdb::unique_ptr<BoundComparisonExpression>(new BoundComparisonExpression(deserializer.Get<ExpressionType>(), std::move(left), std::move(right)));
	return std::move(result);
}